

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int PHF::init<unsigned_long,true>
              (phf *phf,unsigned_long *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  uint64_t k_00;
  ulong uVar3;
  byte bVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  size_t __nmemb;
  size_t sVar8;
  unsigned_long *__base;
  int *piVar9;
  uint32_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  unsigned_long *puVar14;
  unsigned_long *puVar15;
  ulong uVar16;
  unsigned_long *puVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  unsigned_long *puVar21;
  void *local_50;
  void *local_40;
  
  uVar18 = n + (n == 0);
  uVar11 = l + (l == 0);
  sVar8 = 100;
  if (a < 100) {
    sVar8 = a;
  }
  phf->nodiv = true;
  if (uVar18 <= uVar11) {
    uVar11 = uVar18;
  }
  __nmemb = phf_powerup(uVar18 / uVar11);
  sVar8 = phf_powerup((uVar18 * 100) / (sVar8 + (sVar8 == 0)));
  if (sVar8 == 0 || __nmemb == 0) {
    iVar13 = 0x22;
  }
  else {
    __base = (unsigned_long *)calloc(uVar18,0x18);
    if ((__base == (unsigned_long *)0x0) || (local_50 = calloc(__nmemb,8), local_50 == (void *)0x0))
    {
      local_40 = (void *)0x0;
      local_50 = (void *)0x0;
    }
    else {
      puVar17 = __base + 2;
      for (sVar20 = 0; n != sVar20; sVar20 = sVar20 + 1) {
        k_00 = k[sVar20];
        uVar5 = phf_g(k_00,seed);
        uVar6 = uVar5 & (int)__nmemb - 1U;
        puVar17[-2] = k_00;
        *(uint *)(puVar17 + -1) = uVar6;
        plVar1 = (long *)((long)local_50 + (ulong)uVar6 * 8);
        *plVar1 = *plVar1 + 1;
        *puVar17 = (unsigned_long)((long)local_50 + (ulong)uVar6 * 8);
        puVar17 = puVar17 + 3;
      }
      qsort(__base,uVar18,0x18,phf_keycmp<unsigned_long>);
      uVar11 = sVar8 + 0x3f >> 6;
      local_40 = calloc(uVar11 * 2,8);
      if (local_40 == (void *)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        puVar10 = (uint32_t *)calloc(__nmemb,4);
        if (puVar10 != (uint32_t *)0x0) {
          uVar18 = 0;
          puVar17 = __base;
LAB_0012e430:
          uVar18 = uVar18 & 0xffffffff;
          if ((puVar17 < __base + n * 3) && (*(long *)puVar17[2] != 0)) {
            puVar21 = puVar17 + *(long *)puVar17[2] * 3;
            uVar19 = 0;
            do {
              uVar19 = uVar19 + 1;
              puVar14 = puVar17;
              while( true ) {
                uVar5 = (uint32_t)uVar19;
                puVar15 = puVar17;
                if (puVar21 <= puVar14) goto LAB_0012e4e4;
                uVar7 = phf_f_mod_m<true,unsigned_long>(uVar5,*puVar14,seed,sVar8);
                uVar12 = (ulong)(uVar7 >> 6);
                uVar16 = 1L << ((byte)uVar7 & 0x3f);
                if (((*(ulong *)((long)local_40 + uVar12 * 8) >> ((ulong)uVar7 & 0x3f) & 1) != 0) ||
                   (uVar3 = *(ulong *)((long)local_40 + uVar12 * 8 + uVar11 * 8),
                   (uVar3 & uVar16) != 0)) break;
                *(ulong *)((long)local_40 + uVar12 * 8 + uVar11 * 8) = uVar3 | uVar16;
                puVar14 = puVar14 + 3;
              }
              for (; puVar15 < puVar21; puVar15 = puVar15 + 3) {
                uVar7 = phf_f_mod_m<true,unsigned_long>(uVar5,*puVar15,seed,sVar8);
                bVar4 = (byte)uVar7 & 0x3f;
                puVar2 = (ulong *)((long)local_40 + (ulong)(uVar7 >> 6) * 8 + uVar11 * 8);
                *puVar2 = *puVar2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
              }
            } while( true );
          }
          phf->seed = seed;
          phf->r = __nmemb;
          phf->m = sVar8;
          phf->g = puVar10;
          phf->d_max = uVar18;
          phf->g_op = PHF_G_UINT32_BAND_R;
          phf->g_jmp = (void *)0x0;
          iVar13 = 0;
          goto LAB_0012e395;
        }
      }
    }
    piVar9 = __errno_location();
    iVar13 = *piVar9;
LAB_0012e395:
    free(local_40);
    free(local_50);
    free(__base);
  }
  return iVar13;
LAB_0012e4e4:
  for (; puVar15 < puVar21; puVar15 = puVar15 + 3) {
    uVar7 = phf_f_mod_m<true,unsigned_long>(uVar5,*puVar15,seed,sVar8);
    puVar2 = (ulong *)((long)local_40 + (ulong)(uVar7 >> 6) * 8);
    *puVar2 = *puVar2 | 1L << ((byte)uVar7 & 0x3f);
  }
  puVar10[(uint)puVar17[1]] = uVar5;
  puVar17 = puVar21;
  if (uVar18 < uVar19) {
    uVar18 = uVar19;
  }
  goto LAB_0012e430;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}